

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
deci::parser_t::value_type::as<std::__cxx11::string>(value_type *this)

{
  bool bVar1;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O2/iec61131.y.hpp"
                  ,0x136,"T &deci::parser_t::value_type::as() [T = std::basic_string<char>]");
  }
  bVar1 = std::type_info::operator==(this->yytypeid_,(type_info *)&std::__cxx11::string::typeinfo);
  if (bVar1) {
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  }
  __assert_fail("*yytypeid_ == typeid (T)",
                "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O2/iec61131.y.hpp"
                ,0x137,"T &deci::parser_t::value_type::as() [T = std::basic_string<char>]");
}

Assistant:

T&
    as () YY_NOEXCEPT
    {
      YY_ASSERT (yytypeid_);
      YY_ASSERT (*yytypeid_ == typeid (T));
      YY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }